

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRandomShaderTests.cpp
# Opt level: O3

RandomShaderCase * __thiscall
deqp::gles2::Functional::anon_unknown_1::createRandomShaderCase
          (anon_unknown_1 *this,Context *context,char *description,ProgramParameters *baseParams,
          deUint32 seed,bool vertex,bool fragment)

{
  RandomShaderCase *this_00;
  long lVar1;
  ProgramParameters *pPVar2;
  ProgramParameters params;
  long *local_228;
  long local_218 [2];
  ProgramParameters local_208;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  pPVar2 = &local_208;
  for (lVar1 = 0x1a; lVar1 != 0; lVar1 = lVar1 + -1) {
    pPVar2->seed = baseParams->seed;
    baseParams = (ProgramParameters *)&baseParams->version;
    pPVar2 = (ProgramParameters *)&pPVar2->version;
  }
  local_208.fragmentParameters.randomize = fragment;
  local_208.seed = seed;
  local_208.vertexParameters.randomize = vertex;
  this_00 = (RandomShaderCase *)operator_new(0x4d0);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  deqp::gls::RandomShaderCase::RandomShaderCase
            (this_00,(TestContext *)this,(RenderContext *)context,(char *)local_228,description,
             &local_208);
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  return this_00;
}

Assistant:

gls::RandomShaderCase* createRandomShaderCase (Context& context, const char* description, const rsg::ProgramParameters& baseParams, deUint32 seed, bool vertex, bool fragment)
{
	rsg::ProgramParameters params = baseParams;

	params.seed							= seed;
	params.vertexParameters.randomize	= vertex;
	params.fragmentParameters.randomize	= fragment;

	return new gls::RandomShaderCase(context.getTestContext(), context.getRenderContext(), de::toString(seed).c_str(), description, params);
}